

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitDestructuredRestArray
               (ParseNode *elem,RegSlot iteratorLocation,RegSlot nextMethodReg,
               RegSlot shouldCallReturnFunctionLocation,
               RegSlot shouldCallReturnFunctionLocationFinally,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  RegSlot R0;
  ParseNode *elem_00;
  bool bVar1;
  OpCode op;
  RegSlot R0_00;
  RegSlot RVar2;
  ByteCodeLabel labelID;
  RegSlot value;
  uint uVar3;
  ByteCodeLabel labelID_00;
  RegSlot value_00;
  ParseNodeUni *pPVar4;
  ByteCodeWriter *pBVar5;
  
  R0_00 = FuncInfo::AcquireTmpRegister(funcInfo);
  pPVar4 = ParseNode::AsParseNodeUni(elem);
  bVar1 = false;
  if ((pPVar4->pnode1->nop & ~knopInt) != knopObjectPattern) {
    pPVar4 = ParseNode::AsParseNodeUni(elem);
    if ((byte)(pPVar4->pnode1->nop + ~knopLetDecl) < 0xfd) {
      pBVar5 = &byteCodeGenerator->m_writer;
      Js::ByteCodeWriter::Reg1(pBVar5,LdTrue_ReuseLoc,shouldCallReturnFunctionLocation);
      Js::ByteCodeWriter::Reg1(pBVar5,LdTrue_ReuseLoc,shouldCallReturnFunctionLocationFinally);
      pPVar4 = ParseNode::AsParseNodeUni(elem);
      EmitReference(pPVar4->pnode1,byteCodeGenerator,funcInfo);
      Js::ByteCodeWriter::Reg1(pBVar5,LdFalse_ReuseLoc,shouldCallReturnFunctionLocation);
      Js::ByteCodeWriter::Reg1(pBVar5,LdFalse_ReuseLoc,shouldCallReturnFunctionLocationFinally);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  pBVar5 = &byteCodeGenerator->m_writer;
  Js::ByteCodeWriter::Reg1Unsigned1(pBVar5,NewScArray,R0_00,0);
  R0 = elem->location;
  RVar2 = ByteCodeGenerator::EnregisterConstant(byteCodeGenerator,0);
  Js::ByteCodeWriter::Reg2(pBVar5,Ld_A,R0,RVar2);
  labelID = Js::ByteCodeWriter::DefineLabel(pBVar5);
  Js::ByteCodeWriter::MarkLabel(pBVar5,labelID);
  RVar2 = FuncInfo::AcquireTmpRegister(funcInfo);
  EmitFunctionCall(RVar2,nextMethodReg,iteratorLocation,0xffffffff,byteCodeGenerator,funcInfo);
  EmitThrowOnNotObject(RVar2,byteCodeGenerator);
  value = FuncInfo::AcquireTmpRegister(funcInfo);
  uVar3 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar2,0x74,false,false);
  Js::ByteCodeWriter::PatchableProperty(pBVar5,LdFld,value,RVar2,uVar3,false,false);
  labelID_00 = Js::ByteCodeWriter::DefineLabel(pBVar5);
  Js::ByteCodeWriter::BrReg1(pBVar5,BrTrue_A,labelID_00,value);
  value_00 = FuncInfo::AcquireTmpRegister(funcInfo);
  uVar3 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar2,0x197,false,false);
  Js::ByteCodeWriter::PatchableProperty(pBVar5,LdFld,value_00,RVar2,uVar3,false,false);
  Js::ByteCodeWriter::Reg1(pBVar5,LdTrue_ReuseLoc,shouldCallReturnFunctionLocation);
  Js::ByteCodeWriter::Reg1(pBVar5,LdTrue_ReuseLoc,shouldCallReturnFunctionLocationFinally);
  op = ByteCodeGenerator::GetStElemIOpCode(funcInfo);
  Js::ByteCodeWriter::Element(pBVar5,op,value_00,R0_00,R0,false,false);
  FuncInfo::ReleaseTmpRegister(funcInfo,value_00);
  FuncInfo::ReleaseTmpRegister(funcInfo,value);
  FuncInfo::ReleaseTmpRegister(funcInfo,RVar2);
  Js::ByteCodeWriter::Reg2(pBVar5,Incr_A,R0,R0);
  Js::ByteCodeWriter::Reg1(pBVar5,LdFalse_ReuseLoc,shouldCallReturnFunctionLocation);
  Js::ByteCodeWriter::Reg1(pBVar5,LdFalse_ReuseLoc,shouldCallReturnFunctionLocationFinally);
  Js::ByteCodeWriter::Br(pBVar5,labelID);
  Js::ByteCodeWriter::MarkLabel(pBVar5,labelID_00);
  pPVar4 = ParseNode::AsParseNodeUni(elem);
  elem_00 = pPVar4->pnode1;
  if (bVar1) {
    EmitAssignment((ParseNode *)0x0,elem_00,R0_00,byteCodeGenerator,funcInfo);
    FuncInfo::ReleaseReference(funcInfo,elem_00);
  }
  else {
    EmitDestructuredElement(elem_00,R0_00,byteCodeGenerator,funcInfo);
  }
  FuncInfo::ReleaseTmpRegister(funcInfo,R0_00);
  return;
}

Assistant:

void EmitDestructuredRestArray(
    ParseNode* elem,
    Js::RegSlot iteratorLocation,
    Js::RegSlot nextMethodReg,
    Js::RegSlot shouldCallReturnFunctionLocation,
    Js::RegSlot shouldCallReturnFunctionLocationFinally,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    Js::RegSlot restArrayLocation = funcInfo->AcquireTmpRegister();
    bool isAssignmentTarget = !(elem->AsParseNodeUni()->pnode1->IsPattern() || elem->AsParseNodeUni()->pnode1->IsVarLetOrConst());

    if (isAssignmentTarget)
    {
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocation);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocationFinally);
        EmitReference(elem->AsParseNodeUni()->pnode1, byteCodeGenerator, funcInfo);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocation);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocationFinally);
    }

    byteCodeGenerator->Writer()->Reg1Unsigned1(
        Js::OpCode::NewScArray,
        restArrayLocation,
        ByteCodeGenerator::DefaultArraySize);

    // BytecodeGen can't convey to IRBuilder that some of the temporaries used here are live. When we
    // have a rest parameter, a counter is used in a loop for the array index, but there is no way to
    // convey this is live on the back edge.
    // As a workaround, we have a persistent var reg that is used for the loop counter
    Js::RegSlot counterLocation = elem->location;
    // TODO[ianhall]: Is calling EnregisterConstant() during Emit phase allowed?
    Js::RegSlot zeroConstantReg = byteCodeGenerator->EnregisterConstant(0);
    byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, counterLocation, zeroConstantReg);

    // loopTop:
    Js::ByteCodeLabel loopTop = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->MarkLabel(loopTop);

    Js::RegSlot itemLocation = funcInfo->AcquireTmpRegister();

    EmitFunctionCall(
        itemLocation,
        nextMethodReg,
        iteratorLocation,
        byteCodeGenerator,
        funcInfo);

    EmitThrowOnNotObject(itemLocation, byteCodeGenerator);

    Js::RegSlot doneLocation = funcInfo->AcquireTmpRegister();
    EmitGetObjectProperty(
        doneLocation,
        itemLocation,
        Js::PropertyIds::done,
        byteCodeGenerator,
        funcInfo);

    Js::ByteCodeLabel iteratorDone = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, iteratorDone, doneLocation);

    Js::RegSlot valueLocation = funcInfo->AcquireTmpRegister();
    EmitGetObjectProperty(
        valueLocation,
        itemLocation,
        Js::PropertyIds::value,
        byteCodeGenerator,
        funcInfo);

    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocation);
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocationFinally);

    byteCodeGenerator->Writer()->Element(
        ByteCodeGenerator::GetStElemIOpCode(funcInfo),
        valueLocation, restArrayLocation, counterLocation);
    funcInfo->ReleaseTmpRegister(valueLocation);
    funcInfo->ReleaseTmpRegister(doneLocation);
    funcInfo->ReleaseTmpRegister(itemLocation);

    byteCodeGenerator->Writer()->Reg2(Js::OpCode::Incr_A, counterLocation, counterLocation);

    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocation);
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocationFinally);

    byteCodeGenerator->Writer()->Br(loopTop);

    // iteratorDone:
    byteCodeGenerator->Writer()->MarkLabel(iteratorDone);

    ParseNode *restElem = elem->AsParseNodeUni()->pnode1;
    if (isAssignmentTarget)
    {
        EmitAssignment(nullptr, restElem, restArrayLocation, byteCodeGenerator, funcInfo);
        funcInfo->ReleaseReference(restElem);
    }
    else
    {
        EmitDestructuredElement(restElem, restArrayLocation, byteCodeGenerator, funcInfo);
    }

    funcInfo->ReleaseTmpRegister(restArrayLocation);
}